

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetriang.cpp
# Opt level: O0

void pzshape::TPZShapeTriang::Shape
               (TPZVec<double> *pt,TPZVec<long> *id,TPZVec<int> *order,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  long lVar5;
  int *piVar6;
  double *pdVar7;
  long *plVar8;
  TPZVec<int> *in_RDX;
  TPZVec<long> *in_RSI;
  double dVar9;
  int d_1;
  int i_1;
  TPZFNMatrix<100,_double> dphin;
  TPZFNMatrix<50,_double> phin;
  int nsh;
  int ord;
  int xj;
  int i;
  TPZShapeLinear *shplin;
  TPZFNMatrix<100,_double> dphin_1;
  TPZFNMatrix<50,_double> phin_1;
  int ord2;
  TPZVec<long> ids;
  TPZManVector<double,_1> outvec;
  int rib;
  int shape;
  REAL out;
  TPZFNMatrix<100,_double> dphiblend;
  TPZFNMatrix<50,_double> phiblend;
  int d;
  int is;
  TPZVec<long> *in_stack_ffffffffffffec08;
  TPZManVector<double,_1> *in_stack_ffffffffffffec10;
  TPZFMatrix<double> *in_stack_ffffffffffffec18;
  TPZFMatrix<double> *in_stack_ffffffffffffec20;
  TPZFMatrix<double> *in_stack_ffffffffffffec28;
  TPZFNMatrix<100,_double> *in_stack_ffffffffffffec30;
  TPZVec<long> *in_stack_ffffffffffffec38;
  TPZManVector<double,_1> *in_stack_ffffffffffffec40;
  TPZFMatrix<double> *in_stack_ffffffffffffed60;
  TPZFMatrix<double> *in_stack_ffffffffffffed68;
  TPZVec<double> *in_stack_ffffffffffffed70;
  int local_1268;
  int local_1264;
  int local_c70;
  int local_c6c;
  int in_stack_fffffffffffff914;
  TPZFMatrix<double> *in_stack_fffffffffffff918;
  TPZFMatrix<double> *in_stack_fffffffffffff920;
  int in_stack_fffffffffffff92c;
  TPZVec<double> *in_stack_fffffffffffff930;
  TPZVec<long> local_678 [2];
  int local_630;
  int local_62c;
  int local_30;
  int local_2c;
  TPZVec<int> *local_18;
  TPZVec<long> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  ShapeCorner((TPZVec<double> *)in_stack_ffffffffffffec30,in_stack_ffffffffffffec28,
              in_stack_ffffffffffffec20);
  piVar6 = TPZVec<int>::operator[](local_18,0);
  if ((((1 < *piVar6) || (piVar6 = TPZVec<int>::operator[](local_18,1), 1 < *piVar6)) ||
      (piVar6 = TPZVec<int>::operator[](local_18,2), 1 < *piVar6)) ||
     (piVar6 = TPZVec<int>::operator[](local_18,3), 2 < *piVar6)) {
    TPZFNMatrix<50,_double>::TPZFNMatrix
              ((TPZFNMatrix<50,_double> *)in_stack_ffffffffffffec30,
               (int64_t)in_stack_ffffffffffffec28,(int64_t)in_stack_ffffffffffffec20);
    TPZFNMatrix<100,_double>::TPZFNMatrix
              (in_stack_ffffffffffffec30,(int64_t)in_stack_ffffffffffffec28,
               (int64_t)in_stack_ffffffffffffec20);
    for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
      pdVar7 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffec30->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffec28,(int64_t)in_stack_ffffffffffffec20);
      dVar9 = *pdVar7;
      pdVar7 = TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffec30->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffec28,(int64_t)in_stack_ffffffffffffec20);
      *pdVar7 = dVar9;
      for (local_30 = 0; local_30 < 2; local_30 = local_30 + 1) {
        in_stack_ffffffffffffed70 =
             (TPZVec<double> *)
             TPZFMatrix<double>::operator()
                       (&in_stack_ffffffffffffec30->super_TPZFMatrix<double>,
                        (int64_t)in_stack_ffffffffffffec28,(int64_t)in_stack_ffffffffffffec20);
        in_stack_ffffffffffffed60 = (TPZFMatrix<double> *)in_stack_ffffffffffffed70->_vptr_TPZVec;
        in_stack_ffffffffffffed68 =
             (TPZFMatrix<double> *)
             TPZFMatrix<double>::operator()
                       (&in_stack_ffffffffffffec30->super_TPZFMatrix<double>,
                        (int64_t)in_stack_ffffffffffffec28,(int64_t)in_stack_ffffffffffffec20);
        (in_stack_ffffffffffffed68->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable = (_func_int **)in_stack_ffffffffffffed60;
      }
    }
    ShapeGenerating(in_stack_ffffffffffffed70,in_stack_ffffffffffffed68,in_stack_ffffffffffffed60);
    local_62c = 3;
    for (local_630 = 0; local_630 < 3; local_630 = local_630 + 1) {
      ProjectPoint2dTriangToRib
                ((int)((ulong)in_stack_ffffffffffffec30 >> 0x20),
                 (TPZVec<double> *)in_stack_ffffffffffffec28,(REAL *)in_stack_ffffffffffffec20);
      TPZManVector<double,_1>::TPZManVector
                (in_stack_ffffffffffffec40,(int64_t)in_stack_ffffffffffffec38,
                 (double *)in_stack_ffffffffffffec30);
      TPZVec<long>::TPZVec
                ((TPZVec<long> *)in_stack_ffffffffffffec10,(int64_t)in_stack_ffffffffffffec08);
      plVar8 = TPZVec<long>::operator[](local_10,(long)(local_630 % 3));
      lVar5 = *plVar8;
      plVar8 = TPZVec<long>::operator[](local_678,0);
      *plVar8 = lVar5;
      plVar8 = TPZVec<long>::operator[](local_10,(long)(local_630 + 1 + ((local_630 + 1) / 3) * -3))
      ;
      lVar5 = *plVar8;
      plVar8 = TPZVec<long>::operator[](local_678,1);
      *plVar8 = lVar5;
      piVar6 = TPZVec<int>::operator[](local_18,(long)local_630);
      iVar4 = *piVar6;
      TPZFNMatrix<50,_double>::TPZFNMatrix
                ((TPZFNMatrix<50,_double> *)in_stack_ffffffffffffec30,
                 (int64_t)in_stack_ffffffffffffec28,(int64_t)in_stack_ffffffffffffec20);
      TPZFNMatrix<100,_double>::TPZFNMatrix
                (in_stack_ffffffffffffec30,(int64_t)in_stack_ffffffffffffec28,
                 (int64_t)in_stack_ffffffffffffec20);
      TPZVec<int>::operator[](local_18,(long)local_630);
      TPZShapeLinear::GetTransformId1d(in_stack_ffffffffffffec08);
      TPZShapeLinear::ShapeInternal
                ((TPZVec<double> *)in_stack_ffffffffffffec30,
                 (int)((ulong)in_stack_ffffffffffffec28 >> 0x20),in_stack_ffffffffffffec20,
                 in_stack_ffffffffffffec18,(int)((ulong)in_stack_ffffffffffffec10 >> 0x20));
      TransformDerivativeFromRibToTriang
                ((int)((ulong)in_stack_ffffffffffffec30 >> 0x20),(int)in_stack_ffffffffffffec30,
                 in_stack_ffffffffffffec28);
      for (local_c6c = 0; local_c6c < iVar4 + -1; local_c6c = local_c6c + 1) {
        pdVar7 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffec30->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffec28,(int64_t)in_stack_ffffffffffffec20);
        dVar9 = *pdVar7;
        pdVar7 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffec30->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffec28,(int64_t)in_stack_ffffffffffffec20);
        dVar1 = *pdVar7;
        pdVar7 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffec30->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffec28,(int64_t)in_stack_ffffffffffffec20);
        *pdVar7 = dVar9 * dVar1;
        for (local_c70 = 0; local_c70 < 2; local_c70 = local_c70 + 1) {
          pdVar7 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffec30->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffec28,(int64_t)in_stack_ffffffffffffec20)
          ;
          dVar9 = *pdVar7;
          pdVar7 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffec30->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffec28,(int64_t)in_stack_ffffffffffffec20)
          ;
          dVar1 = *pdVar7;
          pdVar7 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffec30->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffec28,(int64_t)in_stack_ffffffffffffec20)
          ;
          dVar2 = *pdVar7;
          pdVar7 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffec30->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffec28,(int64_t)in_stack_ffffffffffffec20)
          ;
          dVar3 = *pdVar7;
          pdVar7 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffec30->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffec28,(int64_t)in_stack_ffffffffffffec20)
          ;
          *pdVar7 = dVar9 * dVar1 + dVar2 * dVar3;
        }
        local_62c = local_62c + 1;
      }
      TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x18993cd);
      TPZFNMatrix<50,_double>::~TPZFNMatrix((TPZFNMatrix<50,_double> *)0x18993da);
      TPZVec<long>::~TPZVec((TPZVec<long> *)in_stack_ffffffffffffec10);
      TPZManVector<double,_1>::~TPZManVector(in_stack_ffffffffffffec10);
    }
    piVar6 = TPZVec<int>::operator[](local_18,3);
    if (2 < *piVar6) {
      piVar6 = TPZVec<int>::operator[](local_18,3);
      iVar4 = *piVar6;
      TPZFNMatrix<50,_double>::TPZFNMatrix
                ((TPZFNMatrix<50,_double> *)in_stack_ffffffffffffec30,
                 (int64_t)in_stack_ffffffffffffec28,(int64_t)in_stack_ffffffffffffec20);
      TPZFNMatrix<100,_double>::TPZFNMatrix
                (in_stack_ffffffffffffec30,(int64_t)in_stack_ffffffffffffec28,
                 (int64_t)in_stack_ffffffffffffec20);
      TPZVec<int>::operator[](local_18,3);
      GetTransformId2dT(in_stack_ffffffffffffec38);
      ShapeInternal(in_stack_fffffffffffff930,in_stack_fffffffffffff92c,in_stack_fffffffffffff920,
                    in_stack_fffffffffffff918,in_stack_fffffffffffff914);
      for (local_1264 = 0; local_1264 < ((iVar4 + -2) * (iVar4 + -1)) / 2;
          local_1264 = local_1264 + 1) {
        pdVar7 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffec30->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffec28,(int64_t)in_stack_ffffffffffffec20);
        dVar9 = *pdVar7;
        pdVar7 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffec30->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffec28,(int64_t)in_stack_ffffffffffffec20);
        dVar1 = *pdVar7;
        pdVar7 = TPZFMatrix<double>::operator()
                           (&in_stack_ffffffffffffec30->super_TPZFMatrix<double>,
                            (int64_t)in_stack_ffffffffffffec28,(int64_t)in_stack_ffffffffffffec20);
        *pdVar7 = dVar9 * dVar1;
        for (local_1268 = 0; local_1268 < 2; local_1268 = local_1268 + 1) {
          pdVar7 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffec30->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffec28,(int64_t)in_stack_ffffffffffffec20)
          ;
          dVar9 = *pdVar7;
          pdVar7 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffec30->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffec28,(int64_t)in_stack_ffffffffffffec20)
          ;
          in_stack_ffffffffffffec30 = (TPZFNMatrix<100,_double> *)*pdVar7;
          pdVar7 = TPZFMatrix<double>::operator()
                             ((TPZFMatrix<double> *)in_stack_ffffffffffffec30,
                              (int64_t)in_stack_ffffffffffffec28,(int64_t)in_stack_ffffffffffffec20)
          ;
          in_stack_ffffffffffffec20 = (TPZFMatrix<double> *)*pdVar7;
          in_stack_ffffffffffffec28 =
               (TPZFMatrix<double> *)
               TPZFMatrix<double>::operator()
                         (&in_stack_ffffffffffffec30->super_TPZFMatrix<double>,
                          (int64_t)in_stack_ffffffffffffec28,(int64_t)in_stack_ffffffffffffec20);
          dVar9 = dVar9 * (double)in_stack_ffffffffffffec30 +
                  (double)in_stack_ffffffffffffec20 *
                  (double)(in_stack_ffffffffffffec28->super_TPZMatrix<double>).super_TPZBaseMatrix.
                          super_TPZSavable._vptr_TPZSavable;
          pdVar7 = TPZFMatrix<double>::operator()
                             (&in_stack_ffffffffffffec30->super_TPZFMatrix<double>,
                              (int64_t)in_stack_ffffffffffffec28,(int64_t)in_stack_ffffffffffffec20)
          ;
          *pdVar7 = dVar9;
        }
        local_62c = local_62c + 1;
      }
      TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x18997ce);
      TPZFNMatrix<50,_double>::~TPZFNMatrix((TPZFNMatrix<50,_double> *)0x18997db);
    }
    TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x18997f3);
    TPZFNMatrix<50,_double>::~TPZFNMatrix((TPZFNMatrix<50,_double> *)0x1899800);
  }
  return;
}

Assistant:

void TPZShapeTriang::Shape(TPZVec<REAL> &pt, TPZVec<int64_t> &id, TPZVec<int> &order,
							   TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
		ShapeCorner(pt,phi,dphi);
		if (order[0] < 2 && order[1] < 2 && order[2] < 2 && order[3] < 3) return;
		int is,d;
    
        TPZFNMatrix<50,REAL> phiblend(NSides,1);
        TPZFNMatrix<100,REAL> dphiblend(Dimension,NSides);
		for(is=0; is<NCornerNodes; is++)
		{
			phiblend(is,0) = phi(is,0);
			for(d=0; d<Dimension; d++)
			{
				dphiblend(d,is) = dphi(d,is);
			}
		}
		ShapeGenerating(pt,phiblend,dphiblend);
		
		REAL out;
		int shape = 3;
		for (int rib = 0; rib < 3; rib++) {
			
			ProjectPoint2dTriangToRib(rib,pt,out);
			TPZManVector<REAL,1> outvec(1,out);
			TPZVec<int64_t> ids(2);
			ids[0] = id[rib%3];
			ids[1] = id[(rib+1)%3];
			int ord2 = order[rib]-1;//numero de shapes por lado rib
            TPZFNMatrix<50,REAL> phin(ord2,1);
            TPZFNMatrix<100,REAL>dphin(2,ord2);
			TPZShapeLinear *shplin=0;
			shplin->ShapeInternal(outvec,order[rib],phin,dphin,shplin->GetTransformId1d(ids));
//            dphin.Print("dphin= ",std::cout,EMathematicaInput);
			TransformDerivativeFromRibToTriang(rib,ord2,dphin);
			for (int i = 0; i < ord2; i++) {
				phi(shape,0) = phiblend(rib+3,0)*phin(i,0);
				for(int xj=0;xj<2;xj++) {
					dphi(xj,shape) = dphiblend(xj,rib+3)* phin( i, 0)+
					phiblend(rib+3, 0 )* dphin(xj,i);
				}
				shape++;
			}
		}
        
		if (order[3] < 3) return;//ordem na face
		int ord =  order[3]-2;//num de shapes da face
		int nsh = (ord*(ord+1))/2;
        TPZFNMatrix<50,REAL> phin(nsh,1);
        TPZFNMatrix<100,REAL> dphin(2,nsh);
		ShapeInternal(pt,order[3]-2, phin, dphin,GetTransformId2dT(id));
//         dphin.Print("dphin= ",std::cout,EMathematicaInput);
        
		for(int i=0;i<nsh;i++)	{//number of internal shape equal maximal order
			phi(shape,0) = phiblend(6,0)*phin(i,0);
			for(int d=0;d<2;d++) {
				dphi(d,shape) = dphiblend(d,6)* phin(i,0) +
				phiblend(6,0)*dphin(d,i);
			}
			shape++;
		}
	}